

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient2dadapt(double *pa,double *pb,double *pc,double detsum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int eindex;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double Q;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double D [16];
  double C1 [8];
  double C2 [12];
  double dStack_1e0;
  double dStack_1a0;
  double dStack_190;
  double local_178 [4];
  double local_158;
  double dStack_150;
  double local_148;
  double adStack_140 [17];
  double local_b8 [8];
  double local_78 [12];
  
  dVar11 = splitter;
  dVar29 = *pa;
  dVar30 = pa[1];
  dVar28 = *pc;
  dVar9 = pc[1];
  dVar22 = dVar29 - dVar28;
  dVar24 = dVar30 - dVar9;
  dVar13 = *pb;
  dVar7 = pb[1];
  dVar8 = dVar7 - dVar9;
  dVar10 = dVar13 - dVar28;
  dVar15 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar16 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar12 = dVar8 - dVar15;
  dVar14 = dVar10 - dVar16;
  dVar17 = dVar22 * splitter - (dVar22 * splitter - dVar22);
  dVar18 = dVar24 * splitter - (dVar24 * splitter - dVar24);
  dVar31 = dVar22 - dVar17;
  dVar32 = dVar24 - dVar18;
  dVar20 = dVar8 * dVar22;
  dVar21 = dVar10 * dVar24;
  dVar25 = dVar31 * dVar12 - (((dVar20 - dVar17 * dVar15) - dVar31 * dVar15) - dVar17 * dVar12);
  dVar26 = dVar32 * dVar14 - (((dVar21 - dVar18 * dVar16) - dVar32 * dVar16) - dVar18 * dVar14);
  dVar27 = dVar25 - dVar26;
  dVar19 = dVar20 + dVar27;
  dVar20 = (dVar20 - (dVar19 - (dVar19 - dVar20))) + (dVar27 - (dVar19 - dVar20));
  dVar23 = dVar20 - dVar21;
  local_178[0] = (dVar25 - (dVar27 + (dVar25 - dVar27))) + ((dVar25 - dVar27) - dVar26);
  local_178[3] = dVar19 + dVar23;
  local_178[1] = (dVar20 - (dVar23 + (dVar20 - dVar23))) + ((dVar20 - dVar23) - dVar21);
  local_178[2] = (dVar19 - (local_178[3] - (local_178[3] - dVar19))) +
                 (dVar23 - (local_178[3] - dVar19));
  dVar17 = -dVar17;
  auVar3._8_4_ = SUB84(dVar18,0);
  auVar3._0_8_ = dVar17;
  auVar3._12_4_ = (uint)((ulong)dVar18 >> 0x20) ^ 0x80000000;
  lVar6 = 1;
  dVar18 = local_178[0];
  do {
    dVar18 = dVar18 + local_178[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if ((dVar18 < ccwerrboundB * detsum) && (-dVar18 < ccwerrboundB * detsum)) {
    dVar19 = (dVar29 - (dVar22 + (dVar29 - dVar22))) + ((dVar29 - dVar22) - dVar28);
    dVar20 = (dVar30 - (dVar24 + (dVar30 - dVar24))) + ((dVar30 - dVar24) - dVar9);
    dVar29 = (dVar7 - (dVar8 + (dVar7 - dVar8))) + ((dVar7 - dVar8) - dVar9);
    dVar30 = (dVar13 - (dVar10 + (dVar13 - dVar10))) + ((dVar13 - dVar10) - dVar28);
    auVar1._4_4_ = -(uint)(dVar20 != 0.0);
    auVar1._0_4_ = -(uint)(dVar19 != 0.0);
    auVar1._8_4_ = -(uint)(dVar29 != 0.0);
    auVar1._12_4_ = -(uint)(dVar30 != 0.0);
    iVar5 = movmskps(4,auVar1);
    if (iVar5 != 0) {
      dVar28 = detsum * ccwerrboundC + ABS(dVar18) * resulterrbound;
      dVar8 = dVar8 * dVar19;
      dVar10 = dVar10 * dVar20;
      dVar22 = dVar22 * dVar29;
      dVar24 = dVar24 * dVar30;
      dVar18 = ((dVar22 + dVar8) - (dVar24 + dVar10)) + dVar18;
      if ((dVar18 < dVar28) && (-dVar18 < dVar28)) {
        dVar18 = splitter * dVar19 - (splitter * dVar19 - dVar19);
        dVar28 = splitter * dVar20 - (splitter * dVar20 - dVar20);
        dVar13 = dVar19 - dVar18;
        dVar9 = dVar20 - dVar28;
        auVar4._8_4_ = SUB84(dVar9,0);
        auVar4._0_8_ = dVar13;
        auVar4._12_4_ = (int)((ulong)dVar9 >> 0x20);
        auVar2._8_4_ = SUB84(dVar28,0);
        auVar2._0_8_ = dVar18;
        auVar2._12_4_ = (int)((ulong)dVar28 >> 0x20);
        dVar12 = dVar12 * dVar13 - (((dVar8 - dVar18 * dVar15) - dVar15 * dVar13) - dVar18 * dVar12)
        ;
        dVar14 = dVar14 * dVar9 - (((dVar10 - dVar28 * dVar16) - dVar16 * dVar9) - dVar28 * dVar14);
        dVar15 = dVar12 - dVar14;
        dVar7 = dVar8 + dVar15;
        dVar28 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar15 - (dVar7 - dVar8));
        dVar9 = dVar28 - dVar10;
        local_158 = (dVar12 - (dVar15 + (dVar12 - dVar15))) + ((dVar12 - dVar15) - dVar14);
        dStack_150 = (dVar28 - (dVar9 + (dVar28 - dVar9))) + ((dVar28 - dVar9) - dVar10);
        adStack_140[0] = dVar7 + dVar9;
        local_148 = (dVar7 - (adStack_140[0] - (adStack_140[0] - dVar7))) +
                    (dVar9 - (adStack_140[0] - dVar7));
        iVar5 = fast_expansion_sum_zeroelim(4,local_178,4,&local_158,local_b8);
        dVar10 = dVar11 * dVar29;
        dVar11 = dVar11 * dVar30;
        dVar10 = dVar10 - (dVar10 - dVar29);
        dVar11 = dVar11 - (dVar11 - dVar30);
        dVar14 = dVar29 - dVar10;
        dVar15 = dVar30 - dVar11;
        dStack_190 = auVar3._8_8_;
        dVar9 = dVar31 * dVar14 - (dVar17 * dVar14 + -dVar31 * dVar10 + dVar17 * dVar10 + dVar22);
        dVar7 = dVar32 * dVar15 -
                (dStack_190 * dVar15 + -dVar32 * dVar11 + dStack_190 * dVar11 + dVar24);
        dVar12 = dVar9 - dVar7;
        dVar8 = dVar22 + dVar12;
        dVar17 = (dVar22 - (dVar8 - (dVar8 - dVar22))) + (dVar12 - (dVar8 - dVar22));
        dVar28 = dVar17 - dVar24;
        local_158 = (dVar9 - (dVar12 + (dVar9 - dVar12))) + ((dVar9 - dVar12) - dVar7);
        dStack_150 = (dVar17 - (dVar28 + (dVar17 - dVar28))) + ((dVar17 - dVar28) - dVar24);
        adStack_140[0] = dVar8 + dVar28;
        local_148 = (dVar8 - (adStack_140[0] - (adStack_140[0] - dVar8))) +
                    (dVar28 - (adStack_140[0] - dVar8));
        iVar5 = fast_expansion_sum_zeroelim(iVar5,local_b8,4,&local_158,local_78);
        dVar29 = dVar29 * dVar19;
        dVar30 = dVar30 * dVar20;
        dStack_1a0 = auVar2._8_8_;
        dStack_1e0 = auVar4._8_8_;
        dVar13 = dVar14 * dVar13 -
                 (((dVar29 - dVar18 * dVar10) - dVar10 * dVar13) - dVar18 * dVar14);
        dVar7 = dVar15 * dStack_1e0 -
                (((dVar30 - dStack_1a0 * dVar11) - dVar11 * dStack_1e0) - dStack_1a0 * dVar15);
        dVar9 = dVar13 - dVar7;
        dVar28 = dVar29 + dVar9;
        dVar18 = (dVar29 - (dVar28 - (dVar28 - dVar29))) + (dVar9 - (dVar28 - dVar29));
        dVar17 = dVar18 - dVar30;
        local_158 = (dVar13 - (dVar9 + (dVar13 - dVar9))) + ((dVar13 - dVar9) - dVar7);
        dStack_150 = (dVar18 - (dVar17 + (dVar18 - dVar17))) + ((dVar18 - dVar17) - dVar30);
        adStack_140[0] = dVar28 + dVar17;
        local_148 = (dVar28 - (adStack_140[0] - (adStack_140[0] - dVar28))) +
                    (dVar17 - (adStack_140[0] - dVar28));
        iVar5 = fast_expansion_sum_zeroelim(iVar5,local_78,4,&local_158,adStack_140 + 1);
        dVar18 = adStack_140[iVar5];
      }
    }
  }
  return dVar18;
}

Assistant:

REAL orient2dadapt(REAL *pa, REAL *pb, REAL *pc, REAL detsum)
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail, bcxtail, bcytail;
  INEXACT REAL detleft, detright;
  REAL detlefttail, detrighttail;
  REAL det, errbound;
  REAL B[4], C1[8], C2[12], D[16];
  INEXACT REAL B3;
  int C1length, C2length, Dlength;
  REAL u[4];
  INEXACT REAL u3;
  INEXACT REAL s1, t1;
  REAL s0, t0;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  acx = (REAL) (pa[0] - pc[0]);
  bcx = (REAL) (pb[0] - pc[0]);
  acy = (REAL) (pa[1] - pc[1]);
  bcy = (REAL) (pb[1] - pc[1]);

  Two_Product(acx, bcy, detleft, detlefttail);
  Two_Product(acy, bcx, detright, detrighttail);

  Two_Two_Diff(detleft, detlefttail, detright, detrighttail,
               B3, B[2], B[1], B[0]);
  B[3] = B3;

  det = estimate(4, B);
  errbound = ccwerrboundB * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pc[0], acx, acxtail);
  Two_Diff_Tail(pb[0], pc[0], bcx, bcxtail);
  Two_Diff_Tail(pa[1], pc[1], acy, acytail);
  Two_Diff_Tail(pb[1], pc[1], bcy, bcytail);

  if ((acxtail == 0.0) && (acytail == 0.0)
      && (bcxtail == 0.0) && (bcytail == 0.0)) {
    return det;
  }

  errbound = ccwerrboundC * detsum + resulterrbound * Absolute(det);
  det += (acx * bcytail + bcy * acxtail)
       - (acy * bcxtail + bcx * acytail);
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Product(acxtail, bcy, s1, s0);
  Two_Product(acytail, bcx, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C1length = fast_expansion_sum_zeroelim(4, B, 4, u, C1);

  Two_Product(acx, bcytail, s1, s0);
  Two_Product(acy, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C2length = fast_expansion_sum_zeroelim(C1length, C1, 4, u, C2);

  Two_Product(acxtail, bcytail, s1, s0);
  Two_Product(acytail, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  Dlength = fast_expansion_sum_zeroelim(C2length, C2, 4, u, D);

  return(D[Dlength - 1]);
}